

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.c
# Opt level: O2

deCommandLine * deCommandLine_parse(char *commandLine)

{
  uint uVar1;
  char cVar2;
  deBool dVar3;
  deMemPool *pool;
  CharPtrArray *arr;
  size_t sVar4;
  char *elem;
  deCommandLine *ptr;
  char **ppcVar5;
  ulong uVar6;
  char cVar7;
  ulong uVar8;
  char *elem_00;
  int iVar9;
  
  pool = deMemPool_createRoot((deMemPoolUtil *)0x0,0);
  if (pool == (deMemPool *)0x0) {
    return (deCommandLine *)0x0;
  }
  arr = (CharPtrArray *)dePoolArray_create(pool,8);
  if (arr != (CharPtrArray *)0x0) {
    sVar4 = strlen(commandLine);
    elem = (char *)deCalloc(sVar4 + 1);
    if (elem != (char *)0x0) {
      dVar3 = CharPtrArray_pushBack(arr,elem);
      ptr = (deCommandLine *)0x0;
      if (dVar3 == 0) goto LAB_00599de4;
      cVar7 = '\0';
      elem_00 = elem;
LAB_00599cd1:
      do {
        while( true ) {
          iVar9 = (int)ptr;
          cVar2 = commandLine[iVar9];
          if (cVar2 == '\0') {
            *elem_00 = '\0';
            ptr = (deCommandLine *)deCalloc(0x18);
            if (ptr != (deCommandLine *)0x0) {
              ppcVar5 = (char **)deCalloc((long)arr->numElements << 3);
              ptr->args = ppcVar5;
              if (ppcVar5 != (char **)0x0) {
                uVar1 = arr->numElements;
                ptr->numArgs = uVar1;
                ptr->argBuf = elem;
                uVar8 = 0;
                uVar6 = (ulong)uVar1;
                if ((int)uVar1 < 1) {
                  uVar6 = uVar8;
                }
                for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
                  ptr->args[uVar8] = arr->pageTable[uVar8 >> 4 & 0xfffffff][(uint)uVar8 & 0xf];
                }
                goto LAB_00599de4;
              }
            }
            deFree(ptr);
            goto LAB_00599dd8;
          }
          if (cVar2 != '\\' || cVar7 == '\0') break;
          ptr = (deCommandLine *)(ulong)(iVar9 + 2);
          cVar2 = commandLine[iVar9 + 1];
          if (cVar2 == 't') {
            cVar2 = '\t';
          }
          else if (cVar2 == 'n') {
            cVar2 = '\n';
          }
LAB_00599d5d:
          *elem_00 = cVar2;
          elem_00 = elem_00 + 1;
        }
        if (cVar2 == cVar7) {
          cVar2 = '\0';
LAB_00599d07:
          ptr = (deCommandLine *)(ulong)(iVar9 + 1);
          cVar7 = cVar2;
          goto LAB_00599cd1;
        }
        if (cVar7 != '\0') {
LAB_00599d53:
          ptr = (deCommandLine *)(ulong)(iVar9 + 1);
          goto LAB_00599d5d;
        }
        if ((cVar2 == '\"') || (cVar2 == '\'')) goto LAB_00599d07;
        if (cVar2 != ' ') goto LAB_00599d53;
        *elem_00 = '\0';
        elem_00 = elem_00 + 1;
        dVar3 = CharPtrArray_pushBack(arr,elem_00);
        cVar7 = '\0';
        ptr = (deCommandLine *)(ulong)(iVar9 + 1);
      } while (dVar3 != 0);
LAB_00599dd8:
      deFree(elem);
    }
  }
  ptr = (deCommandLine *)0x0;
LAB_00599de4:
  deMemPool_destroy(pool);
  return ptr;
}

Assistant:

deCommandLine* deCommandLine_parse (const char* commandLine)
{
	deMemPool*		tmpPool		= deMemPool_createRoot(DE_NULL, 0);
	CharPtrArray*	args		= tmpPool ? CharPtrArray_create(tmpPool) : DE_NULL;
	char*			buf			= DE_NULL;
	char*			outPtr;
	int				pos;
	int				argNdx;
	char			strChr;

	if (!args)
	{
		if (tmpPool)
			deMemPool_destroy(tmpPool);
		return DE_NULL;
	}

	DE_ASSERT(commandLine);

	/* Create buffer for args (no expansion can happen). */
	buf		= (char*)deCalloc(strlen(commandLine)+1);
	pos		= 0;
	argNdx	= 0;
	outPtr	= buf;
	strChr	= 0;

	if (!buf || !CharPtrArray_pushBack(args, buf))
	{
		deMemPool_destroy(tmpPool);
		return DE_NULL;
	}

	while (commandLine[pos] != 0)
	{
		char c = commandLine[pos++];

		if (strChr != 0 && c == '\\')
		{
			/* Escape. */
			c = commandLine[pos++];
			switch (c)
			{
				case 'n':	*outPtr++ = '\n';	break;
				case 't':	*outPtr++ = '\t';	break;
				default:	*outPtr++ = c;		break;
			}
		}
		else if (strChr != 0 && c == strChr)
		{
			/* String end. */
			strChr = 0;
		}
		else if (strChr == 0 && (c == '"' || c == '\''))
		{
			/* String start. */
			strChr = c;
		}
		else if (c == ' ' && strChr == 0)
		{
			/* Arg end. */
			*outPtr++		 = 0;
			argNdx			+= 1;
			if (!CharPtrArray_pushBack(args, outPtr))
			{
				deFree(buf);
				deMemPool_destroy(tmpPool);
				return DE_NULL;
			}
		}
		else
			*outPtr++ = c;
	}

	DE_ASSERT(commandLine[pos] == 0);

	/* Terminate last arg. */
	*outPtr = 0;

	/* Create deCommandLine. */
	{
		deCommandLine* cmdLine = (deCommandLine*)deCalloc(sizeof(deCommandLine));

		if (!cmdLine || !(cmdLine->args = (char**)deCalloc(sizeof(char*)*(size_t)CharPtrArray_getNumElements(args))))
		{
			deFree(cmdLine);
			deFree(buf);
			deMemPool_destroy(tmpPool);
			return DE_NULL;
		}

		cmdLine->numArgs	= CharPtrArray_getNumElements(args);
		cmdLine->argBuf		= buf;

		for (argNdx = 0; argNdx < cmdLine->numArgs; argNdx++)
			cmdLine->args[argNdx] = CharPtrArray_get(args, argNdx);

		deMemPool_destroy(tmpPool);
		return cmdLine;
	}
}